

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O0

void reset_bracket_type(BidiContext *ctx,size_t c,BidiType t)

{
  bool bVar1;
  size_t sStack_18;
  BidiType t_local;
  size_t c_local;
  BidiContext *ctx_local;
  
  sStack_18 = c;
  do {
    ctx->types[ctx->irs[sStack_18]] = t;
    do {
      sStack_18 = sStack_18 + 1;
      bVar1 = false;
      if (sStack_18 < ctx->irslen) {
        bVar1 = ctx->origTypes[ctx->irs[sStack_18]] == BN;
      }
    } while (bVar1);
    bVar1 = false;
    if (sStack_18 < ctx->irslen) {
      bVar1 = ctx->origTypes[ctx->irs[sStack_18]] == NSM;
    }
  } while (bVar1);
  return;
}

Assistant:

static void reset_bracket_type(BidiContext *ctx, size_t c, BidiType t)
{
    /* Final bullet point of rule N0: when we change the type of a
     * bracket, the same change applies to any contiguous sequence of
     * characters after it whose _original_ bidi type was NSM. */
    do {
        ctx->types[ctx->irs[c++]] = t;

#ifndef REMOVE_FORMATTING_CHARS
        while (c < ctx->irslen && ctx->origTypes[ctx->irs[c]] == BN) {
            /* Section 5.2 adjustment: skip past BN in the process. */
            c++;
        }
#endif
    } while (c < ctx->irslen && ctx->origTypes[ctx->irs[c]] == NSM);
}